

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# navigationbar.cpp
# Opt level: O1

void __thiscall QtMWidgets::NavigationBar::showScreen(NavigationBar *this,QWidget *s)

{
  QStack<int> *this_00;
  Type *text;
  Data *dd;
  NavigationBarPrivate *pNVar1;
  QStackedWidget *pQVar2;
  Data *dd_00;
  Data *pDVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  undefined4 uVar7;
  QSharedPointer<QtMWidgets::NavigationItem> *pQVar8;
  pointer piVar9;
  QWidget *local_40;
  QWidget *local_38;
  
  local_38 = s;
  bVar4 = QMap<QWidget_*,_QSharedPointer<QtMWidgets::NavigationItem>_>::contains
                    (&((this->d).d)->itemsMap,&local_38);
  if (!bVar4) {
    return;
  }
  iVar5 = QStackedWidget::currentIndex();
  if (iVar5 == -1) {
    return;
  }
  pQVar8 = QMap<QWidget_*,_QSharedPointer<QtMWidgets::NavigationItem>_>::operator[]
                     (&((this->d).d)->itemsMap,&local_38);
  text = pQVar8->value;
  dd = pQVar8->d;
  if (dd != (Data *)0x0) {
    LOCK();
    (dd->weakref)._q_value.super___atomic_base<int>._M_i =
         (dd->weakref)._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
    LOCK();
    (dd->strongref)._q_value.super___atomic_base<int>._M_i =
         (dd->strongref)._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  pNVar1 = (this->d).d;
  pQVar2 = pNVar1->stack;
  QStackedWidget::currentIndex();
  local_40 = (QWidget *)QStackedWidget::widget((int)pQVar2);
  pQVar8 = QMap<QWidget_*,_QSharedPointer<QtMWidgets::NavigationItem>_>::operator[]
                     (&pNVar1->itemsMap,&local_40);
  dd_00 = pQVar8->d;
  if (dd_00 != (Data *)0x0) {
    LOCK();
    (dd_00->weakref)._q_value.super___atomic_base<int>._M_i =
         (dd_00->weakref)._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
    LOCK();
    (dd_00->strongref)._q_value.super___atomic_base<int>._M_i =
         (dd_00->strongref)._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  pNVar1 = (this->d).d;
  if ((pNVar1->backStack).super_QList<int>.d.size != 0) {
    this_00 = &pNVar1->backStack;
    pDVar3 = (this_00->super_QList<int>).d.d;
    if ((pDVar3 == (Data *)0x0) ||
       (1 < (__int_type)(pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>)) {
      QArrayDataPointer<int>::reallocateAndGrow
                ((QArrayDataPointer<int> *)this_00,GrowsAtEnd,0,(QArrayDataPointer<int> *)0x0);
    }
    piVar9 = QList<int>::data(&this_00->super_QList<int>);
    iVar5 = piVar9[(pNVar1->backStack).super_QList<int>.d.size + -1];
    iVar6 = QStackedWidget::currentIndex();
    if (iVar5 == iVar6) goto LAB_00170843;
  }
  pNVar1 = (this->d).d;
  uVar7 = QStackedWidget::currentIndex();
  local_40 = (QWidget *)CONCAT44(local_40._4_4_,uVar7);
  QtPrivate::QPodArrayOps<int>::emplace<int&>
            ((QPodArrayOps<int> *)&pNVar1->backStack,(pNVar1->backStack).super_QList<int>.d.size,
             (int *)&local_40);
  QAbstractButton::setText((QString *)((this->d).d)->left);
  QWidget::show();
LAB_00170843:
  QList<int>::clear(&(((this->d).d)->forwardStack).super_QList<int>);
  QWidget::hide();
  TextLabel::setText(((this->d).d)->title,&text->title);
  QStackedWidget::setCurrentWidget((QWidget *)((this->d).d)->stack);
  QSharedPointer<QtMWidgets::NavigationItem>::deref(dd_00);
  QSharedPointer<QtMWidgets::NavigationItem>::deref(dd);
  return;
}

Assistant:

void
NavigationBar::showScreen( QWidget * s )
{
	if( d->itemsMap.contains( s ) && currentIndex() != -1 )
	{
		QSharedPointer< NavigationItem > nextItem = d->itemsMap[ s ];
		QSharedPointer< NavigationItem > currentItem =
			d->itemsMap[ d->stack->widget( currentIndex() ) ];

		if( d->backStack.isEmpty() || d->backStack.top() != currentIndex() )
		{
			d->backStack.push( currentIndex() );

			d->left->setText( currentItem->title );
			d->left->show();
		}

		d->forwardStack.clear();
		d->right->hide();

		d->title->setText( nextItem->title );

		d->stack->setCurrentWidget( nextItem->self );
	}
}